

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cpp
# Opt level: O3

void __thiscall
Validator_resetVariableOutsideComponent_Test::~Validator_resetVariableOutsideComponent_Test
          (Validator_resetVariableOutsideComponent_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Validator, resetVariableOutsideComponent)
{
    const std::vector<std::string> expectedIssues = {
        "Reset in component 'c1' with order '1', with variable 'v2', with test_variable 'v1', refers to a variable 'v2' in a different component 'c2'.",
        "Reset in component 'c2' with order '2', with variable 'v2', with test_variable 'v1', refers to a test_variable 'v1' in a different component 'c1'.",
    };

    libcellml::ModelPtr m = libcellml::Model::create();
    libcellml::ComponentPtr c1 = libcellml::Component::create();
    libcellml::ComponentPtr c2 = libcellml::Component::create();
    libcellml::VariablePtr v1 = libcellml::Variable::create();
    libcellml::VariablePtr v2 = libcellml::Variable::create();
    libcellml::ResetPtr r1 = libcellml::Reset::create();
    libcellml::ResetPtr r2 = libcellml::Reset::create();
    libcellml::ValidatorPtr validator = libcellml::Validator::create();

    v1->setName("v1");
    v1->setUnits("dimensionless");
    v2->setName("v2");
    v2->setUnits("dimensionless");

    c1->setName("c1");
    c2->setName("c2");

    c1->addVariable(v1);
    c2->addVariable(v2);

    c1->addReset(r1);
    c2->addReset(r2);

    r1->setVariable(v2); // variable outside parent component
    r1->setTestVariable(v1);
    r1->setOrder(1);
    r1->setResetValue(EMPTY_MATH);
    r1->setTestValue(EMPTY_MATH);

    r2->setVariable(v2);
    r2->setTestVariable(v1); // test_variable outside parent component
    r2->setOrder(2);
    r2->setResetValue(EMPTY_MATH);
    r2->setTestValue(EMPTY_MATH);

    m->setName("model");
    m->addComponent(c1);
    m->addComponent(c2);

    validator->validateModel(m);

    EXPECT_EQ_ISSUES(expectedIssues, validator);
}